

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

bool __thiscall DataRefs::FetchPAc(DataRefs *this)

{
  size_type sVar1;
  pointer pcVar2;
  LTAircraft *pLVar3;
  iterator iVar4;
  bool bVar5;
  FDKeyTy fdKey;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_38;
  
  if ((this->keyAc)._M_string_length == 0) {
    GetDebugAcFilter_abi_cxx11_((string *)local_68,this);
    std::__cxx11::string::operator=((string *)&this->keyAc,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  sVar1 = (this->keyAc)._M_string_length;
  if (sVar1 == 0) {
    bVar5 = false;
  }
  else {
    pcVar2 = (this->keyAc)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + sVar1);
    LTFlightData::FDKeyTy::FDKeyTy((FDKeyTy *)local_68,KEY_ICAO,&local_38,0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    iVar4 = std::
            _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
            ::find(&mapFd._M_t,(key_type *)local_68);
    if ((_Rb_tree_header *)iVar4._M_node == &mapFd._M_t._M_impl.super__Rb_tree_header) {
      bVar5 = false;
      this->pAc = (LTAircraft *)0x0;
      (this->keyAc)._M_string_length = 0;
      *(this->keyAc)._M_dataplus._M_p = '\0';
    }
    else {
      pLVar3 = (LTAircraft *)iVar4._M_node[0x1d]._M_left;
      this->pAc = pLVar3;
      bVar5 = pLVar3 != (LTAircraft *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._8_8_ != &local_50) {
      operator_delete((void *)local_68._8_8_,local_50._0_8_ + 1);
    }
  }
  return bVar5;
}

Assistant:

bool DataRefs::FetchPAc ()
{
    // if there is no a/c defined yet, BUT there is a debug a/c defined
    // then we use that debug a/c
    if ( keyAc.empty() )
        keyAc = GetDebugAcFilter();
    
    // short-cut if there is still no key
    if ( keyAc.empty() )
        return false;
    
    // find that key's element
    LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_ICAO, keyAc);
    mapLTFlightDataTy::const_iterator fdIter = mapFd.find(fdKey);
    if (fdIter != mapFd.end()) {
        // found, save ptr to a/c
        pAc = fdIter->second.GetAircraft();
        // that pointer might be NULL if a/c has not yet been created!
        return pAc != nullptr;
    }

    // not found, clear all ptr/keys
    pAc = nullptr;
    keyAc.clear();
    return false;
}